

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::ext_supported_versions_add_clienthello
               (SSL_HANDSHAKE *hs,CBB *out,CBB *out_compressible,ssl_client_hello_type_t type)

{
  SSL *pSVar1;
  bool bVar2;
  uint16_t uVar3;
  int iVar4;
  pointer psVar5;
  undefined1 local_98 [6];
  uint16_t extra_min_version;
  CBB versions;
  CBB contents;
  SSL *ssl;
  ssl_client_hello_type_t type_local;
  CBB *out_compressible_local;
  CBB *out_local;
  SSL_HANDSHAKE *hs_local;
  
  pSVar1 = hs->ssl;
  if (hs->max_version < 0x304) {
    hs_local._7_1_ = true;
  }
  else {
    out_compressible_local = out;
    if (0x303 < hs->min_version) {
      out_compressible_local = out_compressible;
    }
    iVar4 = CBB_add_u16(out_compressible_local,0x2b);
    if (((iVar4 == 0) ||
        (iVar4 = CBB_add_u16_length_prefixed
                           (out_compressible_local,(CBB *)((long)&versions.u + 0x18)), iVar4 == 0))
       || (iVar4 = CBB_add_u8_length_prefixed((CBB *)((long)&versions.u + 0x18),(CBB *)local_98),
          iVar4 == 0)) {
      hs_local._7_1_ = false;
    }
    else {
      psVar5 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&pSVar1->ctx);
      if ((*(ushort *)&psVar5->field_0x288 >> 5 & 1) != 0) {
        uVar3 = ssl_get_grease_value(hs,ssl_grease_version);
        iVar4 = CBB_add_u16((CBB *)local_98,uVar3);
        if (iVar4 == 0) {
          return false;
        }
      }
      uVar3 = 0;
      if (type == ssl_client_hello_inner) {
        uVar3 = 0x304;
      }
      bVar2 = ssl_add_supported_versions(hs,(CBB *)local_98,uVar3);
      if ((bVar2) && (iVar4 = CBB_flush(out_compressible_local), iVar4 != 0)) {
        hs_local._7_1_ = true;
      }
      else {
        hs_local._7_1_ = false;
      }
    }
  }
  return hs_local._7_1_;
}

Assistant:

static bool ext_supported_versions_add_clienthello(
    const SSL_HANDSHAKE *hs, CBB *out, CBB *out_compressible,
    ssl_client_hello_type_t type) {
  const SSL *const ssl = hs->ssl;
  if (hs->max_version <= TLS1_2_VERSION) {
    return true;
  }

  // supported_versions is compressible in ECH if ClientHelloOuter already
  // requires TLS 1.3. Otherwise the extensions differ in the older versions.
  if (hs->min_version >= TLS1_3_VERSION) {
    out = out_compressible;
  }

  CBB contents, versions;
  if (!CBB_add_u16(out, TLSEXT_TYPE_supported_versions) ||
      !CBB_add_u16_length_prefixed(out, &contents) ||
      !CBB_add_u8_length_prefixed(&contents, &versions)) {
    return false;
  }

  // Add a fake version. See RFC 8701.
  if (ssl->ctx->grease_enabled &&
      !CBB_add_u16(&versions, ssl_get_grease_value(hs, ssl_grease_version))) {
    return false;
  }

  // Encrypted ClientHellos requires TLS 1.3 or later.
  uint16_t extra_min_version =
      type == ssl_client_hello_inner ? TLS1_3_VERSION : 0;
  if (!ssl_add_supported_versions(hs, &versions, extra_min_version) ||
      !CBB_flush(out)) {
    return false;
  }

  return true;
}